

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

unique_ptr<Option,_std::default_delete<Option>_>
addOption<Option,char_const(&)[1],char_const(&)[3],char_const(&)[7]>
          (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Switch_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Switch_*>_>_>
           *coll,char (*args) [1],char (*args_1) [3],char (*args_2) [7])

{
  Option *this;
  pointer *__ptr;
  char *in_R8;
  
  this = (Option *)operator_new(0x28);
  Option::Option<char_const*,char_const*>(this,*args_1,*args_2,in_R8);
  (coll->_M_h)._M_buckets = (__buckets_ptr)this;
  mapOption((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Switch_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Switch_*>_>_>
             *)args,(Switch *)this);
  return (__uniq_ptr_data<Option,_std::default_delete<Option>,_true,_true>)
         (__uniq_ptr_data<Option,_std::default_delete<Option>,_true,_true>)coll;
}

Assistant:

auto addOption(std::unordered_map<std::string, Switch*>& coll, Args&& ...args) -> std::unique_ptr<T> {
    static_assert(std::is_base_of_v<Switch, T>, "T must be derived from Switch");

    auto instance = std::make_unique<T>(std::forward<Args>(args)...);
    mapOption(coll, instance.get());

    return instance;
}